

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O2

bool __thiscall CEditor::PopupEvent(CEditor *this,void *pContext,CUIRect View)

{
  long lVar1;
  int iVar2;
  char *pText;
  bool bVar3;
  long in_FS_OFFSET;
  float LineWidth;
  CUIRect ButtonBar;
  CUIRect Label;
  CUIRect View_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  View_local = View;
  CUIRect::HSplitTop(&View_local,10.0,(CUIRect *)0x0,&View_local);
  CUIRect::HSplitTop(&View_local,30.0,&Label,&View_local);
  if ((ulong)(uint)this->m_PopupEventType < 5) {
    CUI::DoLabel(&this->m_UI,&Label,
                 &DAT_001cecb4 + *(int *)(&DAT_001cecb4 + (ulong)(uint)this->m_PopupEventType * 4),
                 20.0,1,-1.0,true);
  }
  CUIRect::HSplitBottom(&View_local,10.0,&View_local,(CUIRect *)0x0);
  CUIRect::HSplitBottom(&View_local,20.0,&View_local,&ButtonBar);
  CUIRect::HSplitTop(&View_local,30.0,(CUIRect *)0x0,&View_local);
  CUIRect::VMargin(&View_local,40.0,&View_local);
  CUIRect::HSplitTop(&View_local,20.0,&Label,&View_local);
  switch(this->m_PopupEventType) {
  case 0:
    pText = 
    "The map contains unsaved data, you might want to save it before you exit the editor.\nContinue anyway?"
    ;
    break;
  case 1:
    pText = 
    "The map contains unsaved data, you might want to save it before you load a new map.\nContinue anyway?"
    ;
    break;
  case 2:
    pText = 
    "The map contains unsaved data, you might want to save it before you load the current map.\nContinue anyway?"
    ;
    break;
  case 3:
    pText = 
    "The map contains unsaved data, you might want to save it before you create a new map.\nContinue anyway?"
    ;
    break;
  case 4:
    pText = "The file already exists.\nDo you want to overwrite the map?";
    LineWidth = -1.0;
    goto LAB_0019ac36;
  default:
    goto switchD_0019ab8f_default;
  }
  LineWidth = Label.w + -10.0;
LAB_0019ac36:
  CUI::DoLabel(&this->m_UI,&Label,pText,10.0,0,LineWidth,true);
switchD_0019ab8f_default:
  CUIRect::VSplitLeft(&ButtonBar,30.0,(CUIRect *)0x0,&ButtonBar);
  CUIRect::VSplitLeft(&ButtonBar,110.0,&Label,&ButtonBar);
  iVar2 = DoButton_Editor(this,&PopupEvent::s_OkButton,"Ok",0,&Label,0,(char *)0x0);
  if (iVar2 == 0) {
    bVar3 = false;
    CUIRect::VSplitRight(&ButtonBar,30.0,&ButtonBar,(CUIRect *)0x0);
    CUIRect::VSplitRight(&ButtonBar,110.0,&ButtonBar,&Label);
    iVar2 = DoButton_Editor(this,&PopupEvent::s_AbortButton,"Abort",0,&Label,0,(char *)0x0);
    if (iVar2 == 0) goto LAB_0019ada8;
  }
  else {
    switch(this->m_PopupEventType) {
    case 0:
      this->m_pConfig->m_ClEditor = 0;
      break;
    case 1:
      InvokeFileDialog(this,-1,0,"Load map","Load","maps","",CallbackOpenMap,this);
      break;
    case 2:
      LoadCurrentMap(this);
      break;
    case 3:
      Reset(this,true);
      this->m_aFileName[0] = '\0';
      break;
    case 4:
      CallbackSaveMap(this->m_aFileSaveName,0,this);
    }
  }
  this->m_PopupEventWasActivated = 0;
  bVar3 = true;
LAB_0019ada8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CEditor::PopupEvent(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect Label, ButtonBar;

	// title
	View.HSplitTop(10.0f, 0, &View);
	View.HSplitTop(30.0f, &Label, &View);
	if(pEditor->m_PopupEventType == POPEVENT_EXIT)
		pEditor->UI()->DoLabel(&Label, "Exit the editor", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD)
		pEditor->UI()->DoLabel(&Label, "Load map", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD_CURRENT)
		pEditor->UI()->DoLabel(&Label, "Load current map", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_NEW)
		pEditor->UI()->DoLabel(&Label, "New map", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_SAVE)
		pEditor->UI()->DoLabel(&Label, "Save map", 20.0f, TEXTALIGN_CENTER);

	View.HSplitBottom(10.0f, &View, 0);
	View.HSplitBottom(20.0f, &View, &ButtonBar);

	// notification text
	View.HSplitTop(30.0f, 0, &View);
	View.VMargin(40.0f, &View);
	View.HSplitTop(20.0f, &Label, &View);
	if(pEditor->m_PopupEventType == POPEVENT_EXIT)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you exit the editor.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you load a new map.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD_CURRENT)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you load the current map.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_NEW)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you create a new map.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_SAVE)
		pEditor->UI()->DoLabel(&Label, "The file already exists.\nDo you want to overwrite the map?", 10.0f, TEXTALIGN_LEFT);

	// button bar
	ButtonBar.VSplitLeft(30.0f, 0, &ButtonBar);
	ButtonBar.VSplitLeft(110.0f, &Label, &ButtonBar);
	static int s_OkButton = 0;
	if(pEditor->DoButton_Editor(&s_OkButton, "Ok", 0, &Label, 0, 0))
	{
		if(pEditor->m_PopupEventType == POPEVENT_EXIT)
			pEditor->Config()->m_ClEditor = 0;
		else if(pEditor->m_PopupEventType == POPEVENT_LOAD)
			pEditor->InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_MAP, "Load map", "Load", "maps", "", pEditor->CallbackOpenMap, pEditor);
		else if(pEditor->m_PopupEventType == POPEVENT_LOAD_CURRENT)
			pEditor->LoadCurrentMap();
		else if(pEditor->m_PopupEventType == POPEVENT_NEW)
		{
			pEditor->Reset();
			pEditor->m_aFileName[0] = 0;
		}
		else if(pEditor->m_PopupEventType == POPEVENT_SAVE)
			pEditor->CallbackSaveMap(pEditor->m_aFileSaveName, IStorage::TYPE_SAVE, pEditor);
		pEditor->m_PopupEventWasActivated = false;
		return true;
	}
	ButtonBar.VSplitRight(30.0f, &ButtonBar, 0);
	ButtonBar.VSplitRight(110.0f, &ButtonBar, &Label);
	static int s_AbortButton = 0;
	if(pEditor->DoButton_Editor(&s_AbortButton, "Abort", 0, &Label, 0, 0))
	{
		pEditor->m_PopupEventWasActivated = false;
		return true;
	}

	return false;
}